

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O0

bool __thiscall
IR::Instr::IterateMetaArgs<BackwardPass::ProcessInlineeStart(IR::Instr*)::__1>(Instr *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *nextInstr;
  Instr *currentInstr;
  Instr *this_local;
  
  nextInstr = this;
  if (this->m_opcode != InlineeStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1e8,"(this->m_opcode == Js::OpCode::InlineeStart)",
                       "this->m_opcode == Js::OpCode::InlineeStart");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  for (; nextInstr->m_opcode != InlineeMetaArg; nextInstr = nextInstr->m_prev) {
  }
  while (nextInstr->m_prev->m_opcode == InlineeMetaArg) {
    nextInstr = nextInstr->m_prev;
  }
  do {
    if (nextInstr->m_opcode != InlineeMetaArg) {
      return false;
    }
    pIVar1 = nextInstr->m_next;
    bVar3 = BackwardPass::ProcessInlineeStart::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&this_local + 6),nextInstr);
    nextInstr = pIVar1;
  } while (!bVar3);
  return true;
}

Assistant:

bool IterateMetaArgs(Fn callback)
    {
        Assert(this->m_opcode == Js::OpCode::InlineeStart);
        Instr* currentInstr = this;
        while(currentInstr->m_opcode != Js::OpCode::InlineeMetaArg)
        {
            currentInstr = currentInstr->m_prev;
        }
        // backward iteration
        while (currentInstr->m_prev->m_opcode == Js::OpCode::InlineeMetaArg)
        {
            currentInstr = currentInstr->m_prev;
        }

        // forward iteration
        while(currentInstr->m_opcode == Js::OpCode::InlineeMetaArg)
        {
            // cache next instr as callback might move meta arg.
            IR::Instr* nextInstr = currentInstr->m_next;
            if(callback(currentInstr))
            {
                return true;
            }
            currentInstr = nextInstr;
        }
        return false;
    }